

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Parser::checkMacroDefinition(Parser *this)

{
  TokenizerPosition start;
  pointer pCVar1;
  bool bVar2;
  Token *pTVar3;
  Identifier *pIVar4;
  Token *pTVar5;
  iterator iVar6;
  mapped_type *this_00;
  long lVar7;
  iterator iVar8;
  ulong uVar9;
  Tokenizer *pTVar10;
  string_view other;
  string_view other_00;
  string_view other_01;
  Identifier name;
  vector<Expression,_std::allocator<Expression>_> parameters;
  ParserMacro local_b8;
  
  pTVar3 = peekToken(this,0);
  if (pTVar3->type != Identifier) {
    return false;
  }
  pIVar4 = Token::identifierValue(pTVar3);
  if (*(pIVar4->_name)._M_dataplus._M_p != '.') {
    return false;
  }
  pIVar4 = Token::identifierValue(pTVar3);
  other._M_str = ".macro";
  other._M_len = 6;
  bVar2 = Identifier::operator!=(pIVar4,other);
  if (bVar2) {
    return false;
  }
  eatToken(this);
  if (this->initializingMacro == true) {
    printError<>(this,pTVar3,"Nested macro definitions not allowed");
    do {
      do {
        pTVar10 = (this->entries).
                  super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].tokenizer;
        if (*(Tokenizer **)&pTVar10->position == pTVar10) {
          return true;
        }
        pTVar3 = nextToken(this);
      } while (pTVar3->type != Identifier);
      pIVar4 = Token::identifierValue(pTVar3);
      other_00._M_str = ".endmacro";
      other_00._M_len = 9;
      bVar2 = Identifier::operator==(pIVar4,other_00);
    } while (!bVar2);
    return true;
  }
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = parseExpressionList(this,&parameters,1,-1);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_0013fb4e;
  }
  local_b8.name._name._M_dataplus._M_p = (pointer)&local_b8.name._name.field_2;
  local_b8.name._name._M_string_length = 0;
  local_b8.name._name.field_2._M_local_buf[0] = '\0';
  local_b8.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8.labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8.labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_b8.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_b8.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_b8.counter = 0;
  local_b8.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = Expression::evaluateIdentifier
                    (parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_b8.name);
  if (bVar2) {
    lVar7 = 0x18;
    for (uVar9 = 1;
        uVar9 < (ulong)(((long)parameters.
                               super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)parameters.super__Vector_base<Expression,_std::allocator<Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar9 = uVar9 + 1)
    {
      name._name._M_dataplus._M_p = (pointer)&name._name.field_2;
      name._name._M_string_length = 0;
      name._name.field_2._M_local_buf[0] = '\0';
      bVar2 = Expression::evaluateIdentifier
                        ((Expression *)
                         ((long)&((parameters.
                                   super__Vector_base<Expression,_std::allocator<Expression>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->expression).
                                 super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + lVar7),&name);
      if (!bVar2) {
        std::__cxx11::string::~string((string *)&name);
        goto LAB_0013fb42;
      }
      std::vector<Identifier,_std::allocator<Identifier>_>::push_back(&local_b8.parameters,&name);
      std::__cxx11::string::~string((string *)&name);
      lVar7 = lVar7 + 0x18;
    }
    pTVar5 = nextToken(this);
    if (pTVar5->type != Separator) {
      printError<>(this,pTVar3,"Macro directive not terminated");
      goto LAB_0013fb42;
    }
    pTVar10 = (this->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].tokenizer;
    start.it._M_node = (iterator)(pTVar10->position).it._M_node;
    iVar8._M_node = (_List_node_base *)start.it._M_node;
    while ((Tokenizer *)iVar8._M_node != pTVar10) {
      pTVar5 = nextToken(this);
      if (pTVar5->type == Identifier) {
        pIVar4 = Token::identifierValue(pTVar5);
        other_01._M_str = ".endmacro";
        other_01._M_len = 9;
        bVar2 = Identifier::operator==(pIVar4,other_01);
        if (bVar2) break;
      }
      pTVar10 = (this->entries).
                super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].tokenizer;
      iVar8._M_node = (pTVar10->position).it._M_node;
    }
    pCVar1 = (this->conditionStack).
             super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar1[-1].inUnknownBlock == true) {
      printError<>(this,pTVar3,
                   "Macro definition not allowed inside of block with non-trivial condition");
      goto LAB_0013fb42;
    }
    bVar2 = true;
    if (pCVar1[-1].inTrueBlock == true) {
      iVar6 = std::
              _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
              ::find(&(this->macros)._M_t,&local_b8.name);
      if ((_Rb_tree_header *)iVar6._M_node != &(this->macros)._M_t._M_impl.super__Rb_tree_header) {
        printError<Identifier>(this,pTVar3,"Macro \"%s\" already defined",&local_b8.name);
        goto LAB_0013fb42;
      }
      if ((Tokenizer *)iVar8._M_node == pTVar10) {
        printError<Identifier>(this,pTVar3,"Macro \"%s\" not terminated",&local_b8.name);
      }
      else {
        pTVar10 = (this->entries).
                  super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].tokenizer;
        Tokenizer::getTokens
                  ((vector<Token,_std::allocator<Token>_> *)&name,pTVar10,start,
                   (TokenizerPosition)((pTVar10->position).it._M_node)->_M_prev);
        std::vector<Token,_std::allocator<Token>_>::_M_move_assign(&local_b8.content,&name);
        std::vector<Token,_std::allocator<Token>_>::~vector
                  ((vector<Token,_std::allocator<Token>_> *)&name);
        pTVar5 = nextToken(this);
        if (pTVar5->type != Separator) {
          printError<>(this,pTVar3,"Endmacro directive not terminated");
          goto LAB_0013fb42;
        }
        this_00 = std::
                  map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
                  ::operator[](&this->macros,&local_b8.name);
        ParserMacro::operator=(this_00,&local_b8);
      }
    }
  }
  else {
LAB_0013fb42:
    bVar2 = false;
  }
  ParserMacro::~ParserMacro(&local_b8);
LAB_0013fb4e:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&parameters);
  return bVar2;
}

Assistant:

bool Parser::checkMacroDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".macro")
		return false;

	eatToken();

	// nested macro definitions are not allowed
	if (initializingMacro)
	{
		printError(first, "Nested macro definitions not allowed");
		while (!atEnd())
		{
			const Token& token = nextToken();
			if (token.type == TokenType::Identifier && token.identifierValue() == ".endmacro")
				break;
		}

		return true;
	}

	std::vector<Expression> parameters;
	if (!parseExpressionList(parameters,1,-1))
		return false;

	ParserMacro macro;
	macro.counter = 0;

	// load name
	if (!parameters[0].evaluateIdentifier(macro.name))
		return false;

	// load parameters
	for (size_t i = 1; i < parameters.size(); i++)
	{
		Identifier name;
		if (!parameters[i].evaluateIdentifier(name))
			return false;

		macro.parameters.push_back(name);
	}

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Macro directive not terminated");
		return false;
	}

	// load macro content

	TokenizerPosition start = getTokenizer()->getPosition();
	bool valid = false;
	while (!atEnd())
	{
		const Token& tok = nextToken();
		if (tok.type == TokenType::Identifier && tok.identifierValue() == ".endmacro")
		{
			valid = true;
			break;
		}
	}

	// Macros have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Macro definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the macro
	if (!isInsideTrueBlock())
		return true;
	
	// duplicate check
	if (macros.find(macro.name) != macros.end())
	{
		printError(first, "Macro \"%s\" already defined", macro.name);
		return false;
	}

	// no .endmacro, not valid
	if (!valid)
	{
		printError(first, "Macro \"%s\" not terminated", macro.name);
		return true;
	}

	// get content
	TokenizerPosition end = getTokenizer()->getPosition().previous();
	macro.content = getTokenizer()->getTokens(start,end);

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Endmacro directive not terminated");
		return false;
	}

	macros[macro.name] = macro;
	return true;
}